

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
ObjectTest_basic_get_unordered_set_Test::TestBody(ObjectTest_basic_get_unordered_set_Test *this)

{
  __node_base_ptr *pp_Var1;
  pointer *__ptr;
  object obj;
  AssertHelper local_e0 [8];
  char local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_c8;
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_90;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  undefined1 local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = 0;
  pp_Var1 = &local_90._M_single_bucket;
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_std::unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            ((unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             &local_c8,(object *)&local_58._M_first,
             (unordered_set<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> *)
             &local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_c8);
  std::
  _Hashtable<bool,_bool,_std::allocator<bool>,_std::__detail::_Identity,_std::equal_to<bool>,_std::hash<bool>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<bool>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,300,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_std::unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<signed_char,_signed_char,_std::allocator<signed_char>,_std::__detail::_Identity,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<signed char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12d,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_std::unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_char,_unsigned_char,_std::allocator<unsigned_char>,_std::__detail::_Identity,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<unsigned char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12e,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_std::unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            ((unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )&local_c8,(object *)&local_58._M_first,
             (unordered_set<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_> *
             )&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<short,_short,_std::allocator<short>,_std::__detail::_Identity,_std::equal_to<short>,_std::hash<short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<short>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x12f,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_c8,(object *)&local_58._M_first,
             (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<int>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x130,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_c8,(object *)&local_58._M_first,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<long>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x131,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<long long>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x132,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_c8,(object *)&local_58._M_first,
             (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
             &local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<intmax_t>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x133,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_std::unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            ((unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )&local_c8,(object *)&local_58._M_first,
             (unordered_set<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_> *
             )&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<float,_float,_std::allocator<float>,_std::__detail::_Identity,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<float>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x134,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            ((unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<double,_double,_std::allocator<double>,_std::__detail::_Identity,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<double>>().empty()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x135,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_std::unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<long_double,_long_double,_std::allocator<long_double>,_std::__detail::_Identity,_std::equal_to<long_double>,_std::hash<long_double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<long double>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x136,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&local_90);
  if (local_d8[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,
               "obj.get<std::unordered_set<std::u8string>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x137,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_90._M_bucket_count = 1;
  local_90._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_90._M_element_count = 0;
  local_90._M_rehash_policy._M_max_load_factor = 1.0;
  local_90._M_rehash_policy._4_4_ = 0;
  local_90._M_rehash_policy._M_next_resize = 0;
  local_90._M_single_bucket = (__node_base_ptr)0x0;
  local_90._M_buckets = pp_Var1;
  jessilib::object::
  get<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_c8,(object *)&local_58._M_first,
             (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&local_90);
  local_d8[0] = local_c8._M_element_count == 0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_c8);
  std::
  _Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<jessilib::object,_jessilib::object,_std::allocator<jessilib::object>,_std::__detail::_Identity,_std::equal_to<jessilib::object>,_std::hash<jessilib::object>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_90);
  if (local_c8._M_element_count != 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c8,local_d8,"obj.get<std::unordered_set<object>>().empty()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x138,(char *)local_c8._M_buckets);
    testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_e0);
    if ((__node_base *)local_c8._M_buckets != &local_c8._M_before_begin) {
      operator_delete(local_c8._M_buckets,
                      (ulong)((long)&(local_c8._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    if (local_90._M_buckets != (__node_base_ptr *)0x0) {
      (*(code *)(*local_90._M_buckets)[1]._M_nxt)();
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_unordered_set) {
	object obj;

	EXPECT_TRUE(obj.get<std::unordered_set<bool>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<short>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<int>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long long>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<float>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<long double>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::unordered_set<object>>().empty());
}